

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O0

ObjectHeader * __thiscall
Lodtalk::VMContext::newObject
          (VMContext *this,size_t fixedSlotCount,size_t indexableSize,ObjectFormat format,
          int classIndex,int identityHash)

{
  bool bVar1;
  size_t sVar2;
  ObjectHeader OVar3;
  ObjectHeader *ptr;
  ObjectHeader local_c0;
  ObjectHeader local_b0;
  size_t i;
  Object **slots;
  uint8_t *slotStarts;
  ObjectHeader *header;
  uint8_t *data;
  unsigned_long objectSize;
  unsigned_long bodySize;
  bool bigObject;
  unsigned_long headerSize;
  size_t totalSlotCount;
  size_t mask;
  size_t divisor;
  bool hasPrimitiveData;
  int indexableFormatExtraBits;
  size_t indexableSlotSize;
  size_t indexableSlotCount;
  int identityHash_local;
  int classIndex_local;
  ObjectFormat format_local;
  size_t indexableSize_local;
  size_t fixedSlotCount_local;
  VMContext *this_local;
  
  indexableSlotSize = 0;
  sVar2 = variableSlotSizeFor(format);
  divisor._4_4_ = 0;
  bVar1 = false;
  if (((sVar2 != 0) && (indexableSize != 0)) && (indexableSlotSize = indexableSize, 8 < (int)format)
     ) {
    bVar1 = true;
    sVar2 = variableSlotDivisor(format);
    indexableSlotSize = ((indexableSize + sVar2) - 1 & (sVar2 - 1 ^ 0xffffffffffffffff)) / sVar2;
    divisor._4_4_ = (uint)indexableSize & (uint)(sVar2 - 1);
    if (indexableSlotSize * sVar2 < indexableSize) {
      __assert_fail("indexableSize <= indexableSlotCount*divisor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/ObjectModel.cpp"
                    ,0x2e,
                    "ObjectHeader *Lodtalk::VMContext::newObject(size_t, size_t, ObjectFormat, int, int)"
                   );
    }
  }
  OVar3 = (ObjectHeader)(fixedSlotCount + indexableSlotSize);
  ptr = (ObjectHeader *)allocateObjectMemory(this,(long)OVar3 * 8 + 8,0xfe < (ulong)OVar3);
  indexableSlotCount._4_4_ = identityHash;
  if (identityHash < 0) {
    indexableSlotCount._4_4_ = generateIdentityHash(ptr);
  }
  *ptr = (ObjectHeader)0x0;
  local_c0 = OVar3;
  if (0xfe < (ulong)OVar3) {
    local_c0 = (ObjectHeader)0xff;
  }
  *ptr = (ObjectHeader)((ulong)*ptr & 0xffffffffffffff00 | (ulong)local_c0 & 0xff);
  *ptr = (ObjectHeader)
         ((ulong)*ptr & 0xffffffff000003ff | ((ulong)indexableSlotCount._4_4_ & 0x3fffff) << 10);
  *ptr = (ObjectHeader)
         ((ulong)*ptr & 0xffffff07ffffffff | ((ulong)(format + divisor._4_4_) & 0x1f) << 0x23);
  *ptr = (ObjectHeader)((ulong)*ptr & 0x3ffffffffff | (ulong)(uint)classIndex << 0x2a);
  if (0xfe < (ulong)OVar3) {
    ptr[-1] = OVar3;
  }
  if (bVar1) {
    memset(ptr + 1,0,(long)OVar3 * 8);
  }
  else {
    for (local_b0 = (ObjectHeader)0x0; (ulong)local_b0 < (ulong)OVar3;
        local_b0 = (ObjectHeader)((long)local_b0 + 1)) {
      (ptr + 1)[(long)local_b0] = (ObjectHeader)&NilObject;
    }
  }
  return ptr;
}

Assistant:

ObjectHeader *VMContext::newObject(size_t fixedSlotCount, size_t indexableSize, ObjectFormat format, int classIndex, int identityHash)
{
	// Compute the header size.
	size_t indexableSlotCount = 0;
	auto indexableSlotSize = variableSlotSizeFor(format);
	auto indexableFormatExtraBits = 0;
	bool hasPrimitiveData = false;
	if(indexableSlotSize && indexableSize)
	{
		if(format < OF_INDEXABLE_NATIVE_FIRST)
		{
			indexableSlotCount = indexableSize;
		}
#ifndef OBJECT_MODEL_SPUR_64
		else if(format == OF_INDEXABLE_64)
		{
			indexableSlotCount = indexableSize * 2;
			hasPrimitiveData = true;
		}
#endif
		else
		{
			hasPrimitiveData = true;
			size_t divisor = variableSlotDivisor(format);
			size_t mask = (divisor - 1);

		 	indexableSlotCount = ((indexableSize + divisor - 1) & (~mask)) / divisor;
			indexableFormatExtraBits = int(indexableSize & mask);
			assert(indexableSize <= indexableSlotCount*divisor);
		}
	}